

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_convert_rgb(uint *r_out,uint *g_out,uint *b_out,uint r_in,uint g_in,uint b_in,
                        LodePNGColorMode *mode_out,LodePNGColorMode *mode_in)

{
  uchar *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar5 = 0x1f;
  if (LCT_RGBA < mode_in->colortype) {
    return 0x1f;
  }
  bVar2 = 0x10 - (char)mode_out->bitdepth;
  iVar3 = (int)(0xffff / (ulong)(uint)~(-1 << ((byte)mode_in->bitdepth & 0x1f)));
  switch(mode_in->colortype) {
  default:
    uVar4 = iVar3 * r_in;
    uVar6 = uVar4;
    uVar8 = uVar4;
    break;
  case 1:
  case 5:
    goto switchD_0011a6ef_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    uVar4 = iVar3 * b_in;
    uVar6 = g_in * iVar3;
    uVar8 = r_in * iVar3;
    break;
  case LCT_PALETTE:
    if ((ulong)r_in < mode_in->palettesize) {
      puVar1 = mode_in->palette;
      uVar9 = (ulong)(r_in << 2);
      uVar8 = (uint)puVar1[uVar9] * 0x101;
      uVar6 = (uint)puVar1[uVar9 + 1] * 0x101;
      uVar4 = (uint)puVar1[uVar9 + 2] * 0x101;
      break;
    }
    goto LAB_0011a7f5;
  }
  switch(mode_out->colortype) {
  case LCT_GREY:
  case LCT_GREY_ALPHA:
    *r_out = uVar8 >> (bVar2 & 0x1f);
    break;
  default:
    goto switchD_0011a6ef_caseD_1;
  case LCT_RGB:
  case LCT_RGBA:
    *r_out = uVar8 >> (bVar2 & 0x1f);
    *g_out = uVar6 >> (bVar2 & 0x1f);
    *b_out = uVar4 >> (bVar2 & 0x1f);
    break;
  case LCT_PALETTE:
    if (((uVar8 >> 8 == (uVar8 & 0xff)) && (uVar6 >> 8 == (uVar6 & 0xff))) &&
       (uVar4 >> 8 == (uVar4 & 0xff))) {
      uVar7 = 2;
      for (uVar5 = 0; (ulong)uVar5 < mode_out->palettesize; uVar5 = uVar5 + 1) {
        puVar1 = mode_out->palette;
        if (((uVar8 >> 8 == (uint)puVar1[uVar7 - 2]) && (uVar6 >> 8 == (uint)puVar1[uVar7 - 1])) &&
           (uVar4 >> 8 == (uint)puVar1[uVar7])) {
          *r_out = uVar5;
          goto LAB_0011a741;
        }
        uVar7 = uVar7 + 4;
      }
    }
LAB_0011a7f5:
    uVar5 = 0x52;
    goto switchD_0011a6ef_caseD_1;
  }
LAB_0011a741:
  uVar5 = 0;
switchD_0011a6ef_caseD_1:
  return uVar5;
}

Assistant:

unsigned lodepng_convert_rgb(
    unsigned* r_out, unsigned* g_out, unsigned* b_out,
    unsigned r_in, unsigned g_in, unsigned b_in,
    const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in) {
  unsigned r = 0, g = 0, b = 0;
  unsigned mul = 65535 / ((1u << mode_in->bitdepth) - 1u); /*65535, 21845, 4369, 257, 1*/
  unsigned shift = 16 - mode_out->bitdepth;

  if(mode_in->colortype == LCT_GREY || mode_in->colortype == LCT_GREY_ALPHA) {
    r = g = b = r_in * mul;
  } else if(mode_in->colortype == LCT_RGB || mode_in->colortype == LCT_RGBA) {
    r = r_in * mul;
    g = g_in * mul;
    b = b_in * mul;
  } else if(mode_in->colortype == LCT_PALETTE) {
    if(r_in >= mode_in->palettesize) return 82;
    r = mode_in->palette[r_in * 4 + 0] * 257u;
    g = mode_in->palette[r_in * 4 + 1] * 257u;
    b = mode_in->palette[r_in * 4 + 2] * 257u;
  } else {
    return 31;
  }

  /* now convert to output format */
  if(mode_out->colortype == LCT_GREY || mode_out->colortype == LCT_GREY_ALPHA) {
    *r_out = r >> shift ;
  } else if(mode_out->colortype == LCT_RGB || mode_out->colortype == LCT_RGBA) {
    *r_out = r >> shift ;
    *g_out = g >> shift ;
    *b_out = b >> shift ;
  } else if(mode_out->colortype == LCT_PALETTE) {
    unsigned i;
    /* a 16-bit color cannot be in the palette */
    if((r >> 8) != (r & 255) || (g >> 8) != (g & 255) || (b >> 8) != (b & 255)) return 82;
    for(i = 0; i < mode_out->palettesize; i++) {
      unsigned j = i * 4;
      if((r >> 8) == mode_out->palette[j + 0] && (g >> 8) == mode_out->palette[j + 1] &&
          (b >> 8) == mode_out->palette[j + 2]) {
        *r_out = i;
        return 0;
      }
    }
    return 82;
  } else {
    return 31;
  }

  return 0;
}